

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen14Private.cpp
# Opt level: O2

bool __thiscall
COLLADASaxFWL14::ColladaParserAutoGen14Private::_data__constant_attenuation
          (ColladaParserAutoGen14Private *this,ParserChar *text,size_t textLength)

{
  ParserChar **ppPVar1;
  ParserChar *pPVar2;
  ParserChar *pPVar3;
  StackMemoryManager *this_00;
  ParserChar *__dest;
  
  this_00 = &(this->
             super_ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
             ).super_ParserTemplateBase.mStackMemoryManager;
  if ((this->
      super_ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
      ).super_ParserTemplateBase.mLastIncompleteFragmentInCharacterData == (ParserChar *)0x0) {
    pPVar3 = (ParserChar *)GeneratedSaxParser::StackMemoryManager::newObject(this_00,textLength);
    (this->
    super_ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ).super_ParserTemplateBase.mLastIncompleteFragmentInCharacterData = pPVar3;
    memcpy(pPVar3,text,textLength);
    (this->
    super_ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
    ).super_ParserTemplateBase.mEndOfDataInCurrentObjectOnStack =
         (this->
         super_ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
         ).super_ParserTemplateBase.mLastIncompleteFragmentInCharacterData + textLength;
  }
  else {
    pPVar2 = (ParserChar *)GeneratedSaxParser::StackMemoryManager::growObject(this_00,textLength);
    pPVar3 = (this->
             super_ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
             ).super_ParserTemplateBase.mLastIncompleteFragmentInCharacterData;
    __dest = (this->
             super_ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
             ).super_ParserTemplateBase.mEndOfDataInCurrentObjectOnStack;
    if (pPVar2 != pPVar3) {
      __dest = pPVar2 + ((long)__dest - (long)pPVar3);
      (this->
      super_ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
      ).super_ParserTemplateBase.mEndOfDataInCurrentObjectOnStack = __dest;
      (this->
      super_ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
      ).super_ParserTemplateBase.mLastIncompleteFragmentInCharacterData = pPVar2;
    }
    memcpy(__dest,text,textLength);
    ppPVar1 = &(this->
               super_ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
               ).super_ParserTemplateBase.mEndOfDataInCurrentObjectOnStack;
    *ppPVar1 = *ppPVar1 + textLength;
  }
  return true;
}

Assistant:

bool ColladaParserAutoGen14Private::_data__constant_attenuation( const ParserChar* text, size_t textLength )
{
if (!mLastIncompleteFragmentInCharacterData)
{
    mLastIncompleteFragmentInCharacterData = (ParserChar*)mStackMemoryManager.newObject(textLength);
    memcpy(mLastIncompleteFragmentInCharacterData, text, textLength);
    mEndOfDataInCurrentObjectOnStack = mLastIncompleteFragmentInCharacterData + textLength;
}
else
{
    ParserChar* tmp = (ParserChar*)mStackMemoryManager.growObject(textLength);
    if ( tmp != mLastIncompleteFragmentInCharacterData ) {
        mEndOfDataInCurrentObjectOnStack = (mEndOfDataInCurrentObjectOnStack - mLastIncompleteFragmentInCharacterData) + tmp;
        mLastIncompleteFragmentInCharacterData = tmp;
    }
    memcpy(mEndOfDataInCurrentObjectOnStack, text, textLength);
    mEndOfDataInCurrentObjectOnStack += textLength;
}
return true;
}